

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32 *value)

{
  bool bVar1;
  uint uVar2;
  uint8 *local_30;
  uint8 *ptr;
  uint32 *puStack_20;
  uint8 bytes [4];
  uint32 *value_local;
  CodedInputStream *this_local;
  
  puStack_20 = value;
  uVar2 = BufferSize(this);
  if (uVar2 < 4) {
    bVar1 = ReadRaw(this,(void *)((long)&ptr + 4),4);
    if (!bVar1) {
      return false;
    }
    local_30 = (uint8 *)((long)&ptr + 4);
  }
  else {
    local_30 = this->buffer_;
    Advance(this,4);
  }
  ReadLittleEndian32FromArray(local_30,puStack_20);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32* value) {
  uint8 bytes[sizeof(*value)];

  const uint8* ptr;
  if (BufferSize() >= sizeof(*value)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}